

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# battlewithlandlord.cc
# Opt level: O0

void __thiscall
BattleWithLandlord::BattleWithLandlord(BattleWithLandlord *this,istream *is,ostream *os)

{
  mapped_type *pmVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  char c;
  key_type *in_stack_fffffffffffffe58;
  unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
  *in_stack_fffffffffffffe60;
  HashCache *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  multiset<char,_std::less<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  CardStyle *in_stack_fffffffffffffe90;
  undefined8 local_78;
  undefined1 local_55;
  
  std::
  unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
  ::unordered_map((unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
                   *)0x11d6e4);
  std::
  unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
  ::unordered_map((unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
                   *)0x11d6fd);
  local_78 = in_RDI + 0x70;
  do {
    std::multiset<char,_std::less<char>,_std::allocator<char>_>::multiset
              ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x11d73d);
    local_78 = local_78 + 0x30;
  } while (local_78 != in_RDI + 0xd0);
  std::__cxx11::list<CardStyle,_std::allocator<CardStyle>_>::list
            ((list<CardStyle,_std::allocator<CardStyle>_> *)0x11d77a);
  std::multiset<char,_std::less<char>,_std::allocator<char>_>::multiset
            ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x11d7c0);
  CardStyle::CardStyle
            (in_stack_fffffffffffffe90,(Type)((ulong)in_stack_fffffffffffffe88 >> 0x20),
             (int)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
             (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),(int)in_stack_fffffffffffffe78);
  std::multiset<char,_std::less<char>,_std::allocator<char>_>::~multiset
            ((multiset<char,_std::less<char>,_std::allocator<char>_> *)0x11d7f3);
  HashCache::HashCache(in_stack_fffffffffffffe70);
  *(undefined8 *)(in_RDI + 0x178) = in_RSI;
  *(undefined8 *)(in_RDI + 0x180) = in_RDX;
  std::thread::thread((thread *)0x11d84b);
  std::mutex::mutex((mutex *)0x11d85f);
  std::mutex::mutex((mutex *)0x11d873);
  for (local_55 = '3'; local_55 < ':'; local_55 = local_55 + '\x01') {
    pmVar1 = std::
             unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
             ::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    *pmVar1 = local_55 + -0x30;
    pmVar1 = std::
             unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
             ::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    *pmVar1 = local_55;
  }
  pmVar1 = std::
           unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
           ::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  *pmVar1 = '\n';
  pmVar1 = std::
           unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
           ::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  *pmVar1 = '0';
  pmVar1 = std::
           unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
           ::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  *pmVar1 = '\v';
  pmVar1 = std::
           unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
           ::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  *pmVar1 = 'J';
  pmVar1 = std::
           unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
           ::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  *pmVar1 = '\f';
  pmVar1 = std::
           unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
           ::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  *pmVar1 = 'Q';
  pmVar1 = std::
           unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
           ::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  *pmVar1 = '\r';
  pmVar1 = std::
           unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
           ::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  *pmVar1 = 'K';
  pmVar1 = std::
           unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
           ::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  *pmVar1 = '\x0e';
  pmVar1 = std::
           unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
           ::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  *pmVar1 = 'A';
  pmVar1 = std::
           unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
           ::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  *pmVar1 = '\x10';
  pmVar1 = std::
           unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
           ::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  *pmVar1 = '2';
  pmVar1 = std::
           unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
           ::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  *pmVar1 = '\x11';
  pmVar1 = std::
           unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
           ::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  *pmVar1 = 'c';
  pmVar1 = std::
           unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
           ::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  *pmVar1 = '\x12';
  pmVar1 = std::
           unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
           ::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  *pmVar1 = 'C';
  pmVar1 = std::
           unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
           ::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  *pmVar1 = -9;
  pmVar1 = std::
           unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
           ::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  *pmVar1 = 'x';
  pmVar1 = std::
           unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
           ::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  *pmVar1 = -7;
  pmVar1 = std::
           unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
           ::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  *pmVar1 = 'y';
  pmVar1 = std::
           unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
           ::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  *pmVar1 = -5;
  pmVar1 = std::
           unordered_map<char,_char,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_char>_>_>
           ::operator[](in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  *pmVar1 = 'z';
  *(undefined1 *)(in_RDI + 0x134) = 0;
  return;
}

Assistant:

BattleWithLandlord::BattleWithLandlord(istream &is, ostream &os):_is(is), _os(os) {
    for (char c = '3'; c <= '9'; ++c) {
        _name2id[c] = c - '0';
        _id2name[c - '0'] = c;
    }
    _name2id['0'] = 10; _id2name[10] = '0';
    _name2id['J'] = 11; _id2name[11] = 'J';
    _name2id['Q'] = 12; _id2name[12] = 'Q';
    _name2id['K'] = 13; _id2name[13] = 'K';
    _name2id['A'] = 14; _id2name[14] = 'A';
    _name2id['2'] = 16; _id2name[16] = '2';
    _name2id['c'] = 17; _id2name[17] = 'c';
    _name2id['C'] = 18; _id2name[18] = 'C'; //Clown
    _name2id['x'] = -9; _id2name[-9] = 'x';
    _name2id['y'] = -7; _id2name[-7] = 'y';
    _name2id['z'] = -5; _id2name[-5] = 'z';
    _ready = false;
}